

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint128_t t;
  uint64_t nonzero;
  uint64_t mask;
  int flag_local;
  secp256k1_scalar *r_local;
  
  uVar1 = -(ulong)(flag != 0);
  iVar3 = secp256k1_scalar_is_zero(r);
  uVar2 = -(ulong)(iVar3 == 0);
  uVar4 = r->d[0] ^ uVar1;
  uVar6 = (ulong)CARRY8(uVar4,uVar1 & 0xbfd25e8cd0364142);
  r->d[0] = uVar4 + (uVar1 & 0xbfd25e8cd0364142) & uVar2;
  uVar4 = r->d[1] ^ uVar1;
  uVar5 = uVar4 + (uVar1 & 0xbaaedce6af48a03b);
  uVar4 = (ulong)CARRY8(uVar4,uVar1 & 0xbaaedce6af48a03b) + (ulong)CARRY8(uVar6,uVar5);
  r->d[1] = uVar6 + uVar5 & uVar2;
  uVar6 = r->d[2] ^ uVar1;
  uVar5 = uVar6 + (uVar1 & 0xfffffffffffffffe);
  r->d[2] = uVar4 + uVar5 & uVar2;
  r->d[3] = (ulong)CARRY8(uVar6,uVar1 & 0xfffffffffffffffe) + (ulong)CARRY8(uVar4,uVar5) +
            (r->d[3] ^ uVar1) + uVar1 & uVar2;
  return (uint)(uVar1 == 0) * 2 + -1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    uint64_t mask = !flag - 1;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    uint128_t t = (uint128_t)(r->d[0] ^ mask) + ((SECP256K1_N_0 + 1) & mask);
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[1] ^ mask) + (SECP256K1_N_1 & mask);
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[2] ^ mask) + (SECP256K1_N_2 & mask);
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(r->d[3] ^ mask) + (SECP256K1_N_3 & mask);
    r->d[3] = t & nonzero;
    return 2 * (mask == 0) - 1;
}